

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O0

char * coda_type_get_native_type_name(coda_native_type native_type)

{
  char *pcStack_10;
  coda_native_type native_type_local;
  
  switch(native_type) {
  case coda_native_type_int8:
    pcStack_10 = "int8";
    break;
  case coda_native_type_uint8:
    pcStack_10 = "uint8";
    break;
  case coda_native_type_int16:
    pcStack_10 = "int16";
    break;
  case coda_native_type_uint16:
    pcStack_10 = "uint16";
    break;
  case coda_native_type_int32:
    pcStack_10 = "int32";
    break;
  case coda_native_type_uint32:
    pcStack_10 = "uint32";
    break;
  case coda_native_type_int64:
    pcStack_10 = "int64";
    break;
  case coda_native_type_uint64:
    pcStack_10 = "uint64";
    break;
  case coda_native_type_float:
    pcStack_10 = "float";
    break;
  case coda_native_type_double:
    pcStack_10 = "double";
    break;
  case coda_native_type_char:
    pcStack_10 = "char";
    break;
  case coda_native_type_string:
    pcStack_10 = "string";
    break;
  case coda_native_type_bytes:
    pcStack_10 = "bytes";
    break;
  case coda_native_type_not_available:
    pcStack_10 = "N/A";
    break;
  default:
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

LIBCODA_API const char *coda_type_get_native_type_name(coda_native_type native_type)
{
    switch (native_type)
    {
        case coda_native_type_not_available:
            return "N/A";
        case coda_native_type_int8:
            return "int8";
        case coda_native_type_uint8:
            return "uint8";
        case coda_native_type_int16:
            return "int16";
        case coda_native_type_uint16:
            return "uint16";
        case coda_native_type_int32:
            return "int32";
        case coda_native_type_uint32:
            return "uint32";
        case coda_native_type_int64:
            return "int64";
        case coda_native_type_uint64:
            return "uint64";
        case coda_native_type_float:
            return "float";
        case coda_native_type_double:
            return "double";
        case coda_native_type_char:
            return "char";
        case coda_native_type_string:
            return "string";
        case coda_native_type_bytes:
            return "bytes";
    }

    return "unknown";
}